

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_command_line_params.cpp
# Opt level: O1

bool crnlib::command_line_params::split_params(char *p,dynamic_string_array *params)

{
  bool bVar1;
  char c;
  ulong uVar2;
  bool bVar3;
  dynamic_string str;
  dynamic_string local_40;
  
  local_40.m_buf_size = 0;
  local_40.m_len = 0;
  local_40.m_pStr = (char *)0x0;
  c = *p;
  bVar1 = false;
  if (c != '\0') {
    uVar2 = 1;
    bVar1 = false;
    bVar3 = false;
    do {
      if (bVar3) {
        if (bVar1) {
          if (c == '\"') {
            bVar1 = false;
          }
          dynamic_string::append_char(&local_40,c);
        }
        else if (c == '\t') {
LAB_0010f9ef:
          if (local_40.m_len != 0) {
            if (params->m_capacity <= params->m_size) {
              elemental_vector::increase_capacity
                        ((elemental_vector *)params,params->m_size + 1,true,0x10,(object_mover)0x0,
                         false);
            }
            dynamic_string::dynamic_string(params->m_p + params->m_size,&local_40);
            params->m_size = params->m_size + 1;
            dynamic_string::clear(&local_40);
          }
          bVar3 = false;
        }
        else {
          if (c == '\"') {
            bVar1 = true;
          }
          else if (c == ' ') goto LAB_0010f9ef;
          dynamic_string::append_char(&local_40,c);
        }
      }
      else if ((c != '\t') && (c != ' ')) {
        if (c == '\"') {
          bVar1 = true;
        }
        bVar3 = true;
        dynamic_string::append_char(&local_40,c);
      }
      c = p[uVar2];
      uVar2 = (ulong)((int)uVar2 + 1);
    } while (c != '\0');
  }
  if (bVar1) {
    console::error("Unmatched quote in command line \"%s\"",p);
  }
  else if (local_40.m_len != 0) {
    if (params->m_capacity <= params->m_size) {
      elemental_vector::increase_capacity
                ((elemental_vector *)params,params->m_size + 1,true,0x10,(object_mover)0x0,false);
    }
    dynamic_string::dynamic_string(params->m_p + params->m_size,&local_40);
    params->m_size = params->m_size + 1;
  }
  if ((local_40.m_pStr != (char *)0x0) &&
     ((*(uint *)(local_40.m_pStr + -8) ^ *(uint *)(local_40.m_pStr + -4)) == 0xffffffff)) {
    crnlib_free(local_40.m_pStr + -0x10);
  }
  return (bool)~bVar1;
}

Assistant:

bool command_line_params::split_params(const char* p, dynamic_string_array& params) {
  bool within_param = false;
  bool within_quote = false;

  uint ofs = 0;
  dynamic_string str;

  while (p[ofs]) {
    const char c = p[ofs];

    if (within_param) {
      if (within_quote) {
        if (c == '"')
          within_quote = false;

        str.append_char(c);
      } else if ((c == ' ') || (c == '\t')) {
        if (!str.is_empty()) {
          params.push_back(str);
          str.clear();
        }
        within_param = false;
      } else {
        if (c == '"')
          within_quote = true;

        str.append_char(c);
      }
    } else if ((c != ' ') && (c != '\t')) {
      within_param = true;

      if (c == '"')
        within_quote = true;

      str.append_char(c);
    }

    ofs++;
  }

  if (within_quote) {
    console::error("Unmatched quote in command line \"%s\"", p);
    return false;
  }

  if (!str.is_empty())
    params.push_back(str);

  return true;
}